

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

void createargtable(lua_State *L,char **argv,int argc,int script)

{
  ulong uVar1;
  
  uVar1 = 0;
  if (script == argc) {
    script = 0;
  }
  lua_createtable(L,argc - (script + 1),script + 1);
  for (; (uint)(~(argc >> 0x1f) & argc) != uVar1; uVar1 = uVar1 + 1) {
    lua_pushstring(L,argv[uVar1]);
    lua_rawseti(L,-2,uVar1 - (long)script);
  }
  lua_setglobal(L,"arg");
  return;
}

Assistant:

static void createargtable (lua_State *L, char **argv, int argc, int script) {
  int i, narg;
  if (script == argc) script = 0;  /* no script name? */
  narg = argc - (script + 1);  /* number of positive indices */
  lua_createtable(L, narg, script + 1);
  for (i = 0; i < argc; i++) {
    lua_pushstring(L, argv[i]);
    lua_rawseti(L, -2, i - script);
  }
  lua_setglobal(L, "arg");
}